

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O3

NDSTATUS NdDecodeEx2(INSTRUX *Instrux,ND_UINT8 *Code,ND_SIZET Size,ND_UINT8 DefCode,ND_UINT8 DefData
                    ,ND_UINT8 DefStack,ND_UINT8 Vendor)

{
  NDSTATUS NVar1;
  long in_FS_OFFSET;
  ND_CONTEXT local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nd_memset(&local_48,0,0x10);
  local_48._0_8_ =
       (ulong)(byte)(DefCode & 0xf | DefData << 4) | (ulong)((DefStack & 0xf) << 8) |
       (ulong)Vendor << 0xc | local_48._0_8_ & 0xffffffffff000000 | 0xff0000;
  NVar1 = NdDecodeWithContext(Instrux,Code,Size,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return NVar1;
  }
  __stack_chk_fail();
}

Assistant:

NDSTATUS
NdDecodeEx2(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_SIZET Size,
    ND_UINT8 DefCode,
    ND_UINT8 DefData,
    ND_UINT8 DefStack,
    ND_UINT8 Vendor
    )
{
    ND_CONTEXT opt;

    NdInitContext(&opt);

    opt.DefCode = DefCode;
    opt.DefData = DefData;
    opt.DefStack = DefStack;
    opt.VendMode = Vendor;
    opt.FeatMode = ND_FEAT_ALL; // Optimistically decode everything, as if all features are enabled.

    return NdDecodeWithContext(Instrux, Code, Size, &opt);
}